

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_readresp(Curl_easy *data,int sockindex,pingpong *pp,int *ftpcode,size_t *size)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  undefined4 in_register_00000034;
  int code;
  
  CVar2 = Curl_pp_readresp(data,0,(pingpong *)CONCAT44(in_register_00000034,sockindex),&code,
                           (size_t *)ftpcode);
  (data->info).httpcode = code;
  if (pp != (pingpong *)0x0) {
    *(int *)&pp->nread_resp = code;
  }
  if (code == 0x1a5) {
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
      Curl_infof(data,"We got a 421 - timeout");
    }
    _ftp_state(data,'\0');
    CVar2 = CURLE_OPERATION_TIMEDOUT;
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_readresp(struct Curl_easy *data,
                             int sockindex,
                             struct pingpong *pp,
                             int *ftpcode, /* return the ftp-code if done */
                             size_t *size) /* size of the response */
{
  int code;
  CURLcode result = Curl_pp_readresp(data, sockindex, pp, &code, size);

#ifdef HAVE_GSSAPI
  {
    struct connectdata *conn = data->conn;
    char * const buf = Curl_dyn_ptr(&data->conn->proto.ftpc.pp.recvbuf);

    /* handle the security-oriented responses 6xx ***/
    switch(code) {
    case 631:
      code = Curl_sec_read_msg(data, conn, buf, PROT_SAFE);
      break;
    case 632:
      code = Curl_sec_read_msg(data, conn, buf, PROT_PRIVATE);
      break;
    case 633:
      code = Curl_sec_read_msg(data, conn, buf, PROT_CONFIDENTIAL);
      break;
    default:
      /* normal ftp stuff we pass through! */
      break;
    }
  }
#endif

  /* store the latest code for later retrieval */
  data->info.httpcode = code;

  if(ftpcode)
    *ftpcode = code;

  if(421 == code) {
    /* 421 means "Service not available, closing control connection." and FTP
     * servers use it to signal that idle session timeout has been exceeded.
     * If we ignored the response, it could end up hanging in some cases.
     *
     * This response code can come at any point so having it treated
     * generically is a good idea.
     */
    infof(data, "We got a 421 - timeout");
    ftp_state(data, FTP_STOP);
    return CURLE_OPERATION_TIMEDOUT;
  }

  return result;
}